

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test2(void)

{
  int *piVar1;
  bool bVar2;
  int *x;
  pointer piVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_b9;
  priority_queue<int,_std::less<int>_> b;
  priority_queue<int,_std::less<int>_> a;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  a.mData = (int *)operator_new__(4);
  *a.mData = 0;
  a.mCap = 1;
  a.mSize = 0;
  b.mData = (int *)operator_new__(4);
  *b.mData = 0;
  b.mCap = 1;
  b.mSize = 0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
  ._0_4_ = 0xfffffffd;
  stack0xffffffffffffff9c = 0x600000009;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x500000001;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       4;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish._4_4_ =
       2;
  __l._M_len = 7;
  __l._M_array = (iterator)&v2;
  std::vector<int,_std::allocator<int>_>::vector(&v1,__l,(allocator_type *)&local_38);
  local_38 = 0x500000001;
  uStack_30 = 0x200000004;
  local_28 = 0x600000009;
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&v2,__l_00,&local_b9);
  for (piVar3 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar3 != v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar3 = piVar3 + 1) {
    CP::priority_queue<int,_std::less<int>_>::push(&a,piVar3);
  }
  piVar1 = (int *)CONCAT44(v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,
                           v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish._0_4_);
  for (piVar3 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    CP::priority_queue<int,_std::less<int>_>::push(&b,piVar3);
  }
  bVar2 = CP::priority_queue<int,_std::less<int>_>::operator==(&a,&b);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar2 = CP::priority_queue<int,_std::less<int>_>::operator==(&b,&a);
    bVar2 = !bVar2;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v1.super__Vector_base<int,_std::allocator<int>_>);
  CP::priority_queue<int,_std::less<int>_>::~priority_queue(&b);
  CP::priority_queue<int,_std::less<int>_>::~priority_queue(&a);
  return bVar2;
}

Assistant:

bool test2() {
  CP::priority_queue<int> a,b;
  std::vector<int> v1 = {1,5,4,2,-3,9,6};
  std::vector<int> v2 = {1,5,4,2,9,6};
  for (auto &x : v1) { a.push(x); }
  for (auto &x : v2) { b.push(x); }
  return ( ((a == b) == false)  && ((b == a) == false));
}